

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_boomray(char *filename,REF_GRID_conflict ref_grid,REF_DBL *field,REF_INT ldim,
               char **scalar_names,REF_DBL *segment0,REF_DBL *segment1)

{
  int iVar1;
  REF_MPI pRVar2;
  REF_NODE pRVar3;
  REF_GLOB *pRVar4;
  uint uVar5;
  int iVar6;
  FILE *__s;
  long lVar7;
  void *my_array;
  REF_DBL *pRVar8;
  REF_INT *sorted_index;
  int ldim_00;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  REF_DBL *pRVar12;
  char *pcVar13;
  ulong uVar14;
  REF_INT RVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  REF_INT n;
  REF_MPI local_a0;
  undefined8 local_98;
  REF_GLOB *local_90;
  REF_DBL *xyzf;
  REF_DBL *ray_field;
  REF_GRID_conflict ray_grid;
  REF_INT *source;
  REF_DBL ds [3];
  REF_DBL dt [3];
  
  pRVar2 = ref_grid->mpi;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar13 = "unable to open file";
    uVar10 = 0x37d;
  }
  else {
    local_a0 = pRVar2;
    fwrite("title=\"tecplot refine gather\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,__s);
    if (scalar_names == (char **)0x0) {
      if (0 < ldim) {
        uVar5 = 1;
        do {
          fprintf(__s," \"V%d\"",(ulong)uVar5);
          bVar18 = uVar5 != ldim;
          uVar5 = uVar5 + 1;
        } while (bVar18);
      }
    }
    else if (0 < ldim) {
      uVar17 = 0;
      do {
        fprintf(__s," \"%s\"",scalar_names[uVar17]);
        uVar17 = uVar17 + 1;
      } while ((uint)ldim != uVar17);
    }
    fputc(10,__s);
    lVar7 = 0;
    do {
      ds[lVar7] = segment1[lVar7] - segment0[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    uVar5 = ref_math_normalize(ds);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x387,
             "ref_iso_boomray",(ulong)uVar5,"segment unit vector");
      return uVar5;
    }
    uVar5 = ref_iso_cast(&ray_grid,&ray_field,ref_grid,field,ldim,segment0,segment1);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x38b,
             "ref_iso_boomray",(ulong)uVar5,"cast");
      return uVar5;
    }
    local_98 = (REF_DBL *)((ulong)local_98._4_4_ << 0x20);
    pRVar3 = ray_grid->node;
    iVar1 = pRVar3->max;
    lVar7 = (long)iVar1;
    if (lVar7 < 1) {
      iVar6 = 0;
    }
    else {
      lVar9 = 0;
      iVar6 = 0;
      do {
        if (-1 < pRVar3->global[lVar9]) {
          iVar6 = iVar6 + (uint)(pRVar3->ref_mpi->id == pRVar3->part[lVar9]);
        }
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
    }
    uVar17 = (long)ldim + 3;
    ldim_00 = (int)uVar17;
    if (iVar6 * ldim_00 < 0) {
      pcVar13 = "malloc local_xyzf of REF_DBL negative";
      uVar10 = 0x393;
LAB_00177566:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar10,
             "ref_iso_boomray",pcVar13);
      return 1;
    }
    my_array = malloc((ulong)(uint)(iVar6 * ldim_00) << 3);
    if (my_array == (void *)0x0) {
      pcVar13 = "malloc local_xyzf of REF_DBL NULL";
      uVar10 = 0x393;
    }
    else {
      if (iVar1 < 1) {
        RVar15 = 0;
      }
      else {
        local_90 = pRVar3->global;
        lVar9 = 0;
        lVar11 = 0;
        RVar15 = 0;
        pRVar8 = ray_field;
        do {
          if ((-1 < local_90[lVar11]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar11])) {
            pRVar12 = pRVar3->real;
            lVar16 = 0;
            do {
              *(undefined8 *)((long)my_array + lVar16 * 8 + (long)(RVar15 * ldim_00) * 8) =
                   *(undefined8 *)((long)pRVar12 + lVar16 * 8 + lVar9);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            if (0 < ldim) {
              uVar14 = 0;
              do {
                *(REF_DBL *)((long)my_array + (long)(RVar15 * ldim_00 + 3 + (int)uVar14) * 8) =
                     pRVar8[uVar14];
                uVar14 = uVar14 + 1;
              } while ((uint)ldim != uVar14);
            }
            RVar15 = RVar15 + 1;
          }
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x78;
          pRVar8 = pRVar8 + ldim;
        } while (lVar11 != lVar7);
      }
      if (ray_field != (REF_DBL *)0x0) {
        free(ray_field);
      }
      ref_grid_free(ray_grid);
      uVar5 = ref_mpi_allconcat(local_a0,ldim_00,RVar15,my_array,&n,&source,&xyzf,3);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x3a3
               ,"ref_iso_boomray",(ulong)uVar5,"concat");
        return uVar5;
      }
      free(my_array);
      if (local_a0->id != 0) {
        return 0;
      }
      if (source != (REF_INT *)0x0) {
        free(source);
      }
      RVar15 = n;
      lVar7 = (long)n;
      if (lVar7 < 0) {
        pcVar13 = "malloc t of REF_DBL negative";
        uVar10 = 0x3a7;
        goto LAB_00177566;
      }
      pRVar8 = (REF_DBL *)malloc(lVar7 * 8);
      if (pRVar8 == (REF_DBL *)0x0) {
        pcVar13 = "malloc t of REF_DBL NULL";
        uVar10 = 0x3a7;
      }
      else {
        if (RVar15 != 0) {
          lVar9 = 0;
          pRVar12 = xyzf;
          do {
            lVar11 = 0;
            do {
              dt[lVar11] = pRVar12[lVar11] - segment0[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            pRVar8[lVar9] = dt[2] * ds[2] + dt[0] * ds[0] + dt[1] * ds[1];
            lVar9 = lVar9 + 1;
            pRVar12 = pRVar12 + ldim_00;
          } while (lVar9 != lVar7);
        }
        local_98 = pRVar8;
        sorted_index = (REF_INT *)malloc(lVar7 * 4);
        if (sorted_index != (REF_INT *)0x0) {
          uVar5 = ref_sort_heap_dbl(RVar15,local_98,sorted_index);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x3ae,"ref_iso_boomray",(ulong)uVar5,"sort t");
            return uVar5;
          }
          local_a0 = (REF_MPI)sorted_index;
          fprintf(__s," zone t=\"((%.2f,%.2f,%.2f),(%.2f,%.2f,%.2f))\"\n",*segment0,segment0[1],
                  segment0[2],*segment1,segment1[1],segment1[2]);
          pRVar2 = local_a0;
          if (0 < n) {
            local_90 = (REF_GLOB *)0x1;
            if (1 < ldim_00) {
              local_90 = (REF_GLOB *)(uVar17 & 0xffffffff);
            }
            lVar7 = 0;
            do {
              pRVar4 = local_90;
              if (-3 < ldim) {
                lVar9 = 0;
                do {
                  fprintf(__s," %.15e",
                          xyzf[(long)*(int *)((long)pRVar2 + lVar7 * 4) * uVar17 + lVar9]);
                  lVar9 = lVar9 + 1;
                } while ((int)pRVar4 != (int)lVar9);
              }
              fputc(10,__s);
              lVar7 = lVar7 + 1;
            } while (lVar7 < n);
          }
          free(local_a0);
          free(local_98);
          if (xyzf == (REF_DBL *)0x0) {
            return 0;
          }
          free(xyzf);
          return 0;
        }
        pcVar13 = "malloc order of REF_INT NULL";
        uVar10 = 0x3ad;
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar10,
         "ref_iso_boomray",pcVar13);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boomray(const char *filename, REF_GRID ref_grid,
                                   REF_DBL *field, REF_INT ldim,
                                   const char **scalar_names, REF_DBL *segment0,
                                   REF_DBL *segment1) {
  FILE *file;
  REF_DBL ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;
  file = fopen(filename, "w");
  if (NULL == file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  fprintf(file, "title=\"tecplot refine gather\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"");
  if (NULL != scalar_names) {
    for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
  } else {
    for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
  }
  fprintf(file, "\n");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"((%.2f,%.2f,%.2f),(%.2f,%.2f,%.2f))\"\n",
            segment0[0], segment0[1], segment0[2], segment1[0], segment1[1],
            segment1[2]);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }
  return REF_SUCCESS;
}